

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::CompoundStatement::doPrint(CompoundStatement *this,ostream *os)

{
  pointer pSVar1;
  long *plVar2;
  size_t ndx;
  ulong uVar3;
  long lVar4;
  
  std::operator<<(os,"{\n");
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pSVar1 = (this->m_statements).
             super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_statements).
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar3)
    break;
    plVar2 = *(long **)((long)&(pSVar1->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr
                       + lVar4);
    (**(code **)(*plVar2 + 0x10))(plVar2,os);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  std::operator<<(os,"}\n");
  return;
}

Assistant:

void				doPrint				(ostream&		os)						const
	{
		os << "{\n";

		for (size_t ndx = 0; ndx < m_statements.size(); ++ndx)
			os << *m_statements[ndx];

		os << "}\n";
	}